

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiListClipper::End(ImGuiListClipper *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  
  iVar1 = this->ItemsCount;
  if (-1 < iVar1) {
    if (iVar1 != 0x7fffffff) {
      auVar2._0_4_ = (float)iVar1;
      auVar2._4_12_ = in_ZMM0._4_12_;
      auVar2 = vfmadd213ss_fma(auVar2,ZEXT416((uint)this->ItemsHeight),
                               ZEXT416((uint)this->StartPosY));
      SetCursorPosYAndSetupDummyPrevLine(auVar2._0_4_,this->ItemsHeight);
    }
    this->ItemsCount = -1;
    this->StepNo = 3;
  }
  return;
}

Assistant:

void ImGuiListClipper::End()
{
    if (ItemsCount < 0)
        return;
    // In theory here we should assert that ImGui::GetCursorPosY() == StartPosY + DisplayEnd * ItemsHeight, but it feels saner to just seek at the end and not assert/crash the user.
    if (ItemsCount < INT_MAX)
        SetCursorPosYAndSetupDummyPrevLine(StartPosY + ItemsCount * ItemsHeight, ItemsHeight); // advance cursor
    ItemsCount = -1;
    StepNo = 3;
}